

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void __thiscall
capnp::_::StructBuilder::transferContentFrom(StructBuilder *this,StructBuilder other)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = this->dataSize;
  uVar2 = other.dataSize;
  if (uVar1 < other.dataSize) {
    uVar2 = uVar1;
  }
  if (other.dataSize < uVar1) {
    if (uVar1 == 1) {
      *(byte *)this->data = *this->data & 0xfe;
    }
    else if (7 < uVar1 - uVar2) {
      memset((void *)((ulong)(uVar2 >> 3) + (long)this->data),0,(ulong)(uVar1 - uVar2 >> 3));
    }
  }
  if (uVar2 == 1) {
    *(byte *)this->data = *this->data & 0xfe | *other.data & 1;
  }
  else if (7 < uVar2) {
    memcpy(this->data,other.data,(ulong)(uVar2 >> 3));
  }
  uVar3 = this->pointerCount;
  if (uVar3 != 0) {
    lVar5 = 0;
    do {
      WireHelpers::zeroObject
                (this->segment,this->capTable,
                 (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar5));
      lVar5 = lVar5 + 8;
    } while ((ulong)uVar3 * 8 != lVar5);
    if (this->pointerCount != 0) {
      memset(this->pointers,0,(ulong)this->pointerCount << 3);
      uVar3 = this->pointerCount;
      goto LAB_0015b4b9;
    }
  }
  uVar3 = 0;
LAB_0015b4b9:
  if (other.pointerCount <= uVar3) {
    uVar3 = other.pointerCount;
  }
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      WireHelpers::transferPointer
                (this->segment,(WirePointer *)((long)&(this->pointers->offsetAndKind).value + uVar4)
                 ,other.segment,
                 (WirePointer *)((long)&((other.pointers)->offsetAndKind).value + uVar4));
      uVar4 = uVar4 + 8;
    } while ((uint)uVar3 * 8 != uVar4);
    if (uVar3 != 0) {
      memset(other.pointers,0,(ulong)uVar3 << 3);
      return;
    }
  }
  return;
}

Assistant:

void StructBuilder::transferContentFrom(StructBuilder other) {
  // Determine the amount of data the builders have in common.
  auto sharedDataSize = kj::min(dataSize, other.dataSize);

  if (dataSize > sharedDataSize) {
    // Since the target is larger than the source, make sure to zero out the extra bits that the
    // source doesn't have.
    if (dataSize == ONE * BITS) {
      setDataField<bool>(ZERO * ELEMENTS, false);
    } else {
      byte* unshared = reinterpret_cast<byte*>(data) + sharedDataSize / BITS_PER_BYTE;
      // Note: this subtraction can't fail due to the if() above
      WireHelpers::zeroMemory(unshared,
          subtractChecked(dataSize, sharedDataSize, []() {}) / BITS_PER_BYTE);
    }
  }

  // Copy over the shared part.
  if (sharedDataSize == ONE * BITS) {
    setDataField<bool>(ZERO * ELEMENTS, other.getDataField<bool>(ZERO * ELEMENTS));
  } else {
    WireHelpers::copyMemory(reinterpret_cast<byte*>(data),
                            reinterpret_cast<byte*>(other.data),
                            sharedDataSize / BITS_PER_BYTE);
  }

  // Zero out all pointers in the target.
  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);

  // Transfer the pointers.
  auto sharedPointerCount = kj::min(pointerCount, other.pointerCount);
  for (auto i: kj::zeroTo(sharedPointerCount)) {
    WireHelpers::transferPointer(segment, pointers + i, other.segment, other.pointers + i);
  }

  // Zero out the pointers that were transferred in the source because it no longer has ownership.
  // If the source had any extra pointers that the destination didn't have space for, we
  // intentionally leave them be, so that they'll be cleaned up later.
  WireHelpers::zeroMemory(other.pointers, sharedPointerCount);
}